

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void adjust_exif_parameters(JOCTET *data,uint length,JDIMENSION new_width,JDIMENSION new_height)

{
  JOCTET JVar1;
  bool bVar2;
  JDIMENSION new_value;
  uint offset;
  uint firstoffset;
  uint tagnum;
  uint number_of_tags;
  boolean is_motorola;
  JDIMENSION new_height_local;
  JDIMENSION new_width_local;
  uint length_local;
  JOCTET *data_local;
  
  if (length < 0xc) {
    return;
  }
  if ((*data == 'I') && (data[1] == 'I')) {
    bVar2 = false;
  }
  else {
    if (*data != 'M') {
      return;
    }
    if (data[1] != 'M') {
      return;
    }
    bVar2 = true;
  }
  if (bVar2) {
    if (data[2] != '\0') {
      return;
    }
    JVar1 = data[3];
  }
  else {
    if (data[3] != '\0') {
      return;
    }
    JVar1 = data[2];
  }
  if (JVar1 != '*') {
    return;
  }
  if (bVar2) {
    if (data[4] != '\0') {
      return;
    }
    if (data[5] != '\0') {
      return;
    }
    firstoffset = (uint)data[7] + (uint)data[6] * 0x100;
  }
  else {
    if (data[7] != '\0') {
      return;
    }
    if (data[6] != '\0') {
      return;
    }
    firstoffset = (uint)data[4] + (uint)data[5] * 0x100;
  }
  if (length - 2 < firstoffset) {
    return;
  }
  if (bVar2) {
    number_of_tags = (uint)data[firstoffset + 1] + (uint)data[firstoffset] * 0x100;
  }
  else {
    number_of_tags = (uint)data[firstoffset] + (uint)data[firstoffset + 1] * 0x100;
  }
  if (number_of_tags == 0) {
    return;
  }
  firstoffset = firstoffset + 2;
  while( true ) {
    if (length - 0xc < firstoffset) {
      return;
    }
    if (bVar2) {
      tagnum = (uint)data[firstoffset + 1] + (uint)data[firstoffset] * 0x100;
    }
    else {
      tagnum = (uint)data[firstoffset] + (uint)data[firstoffset + 1] * 0x100;
    }
    if (tagnum == 0x8769) break;
    number_of_tags = number_of_tags - 1;
    if (number_of_tags == 0) {
      return;
    }
    firstoffset = firstoffset + 0xc;
  }
  if (bVar2) {
    if (data[firstoffset + 8] != '\0') {
      return;
    }
    if (data[firstoffset + 9] != '\0') {
      return;
    }
    offset = (uint)data[firstoffset + 0xb] + (uint)data[firstoffset + 10] * 0x100;
  }
  else {
    if (data[firstoffset + 0xb] != '\0') {
      return;
    }
    if (data[firstoffset + 10] != '\0') {
      return;
    }
    offset = (uint)data[firstoffset + 8] + (uint)data[firstoffset + 9] * 0x100;
  }
  if (length - 2 < offset) {
    return;
  }
  if (bVar2) {
    number_of_tags = (uint)data[offset + 1] + (uint)data[offset] * 0x100;
  }
  else {
    number_of_tags = (uint)data[offset] + (uint)data[offset + 1] * 0x100;
  }
  if (number_of_tags < 2) {
    return;
  }
  offset = offset + 2;
  do {
    if (length - 0xc < offset) {
      return;
    }
    if (bVar2) {
      tagnum = (uint)data[offset + 1] + (uint)data[offset] * 0x100;
    }
    else {
      tagnum = (uint)data[offset] + (uint)data[offset + 1] * 0x100;
    }
    if ((tagnum == 0xa002) || (tagnum == 0xa003)) {
      new_value._0_2_ = (short)new_height;
      if (tagnum == 0xa002) {
        new_value._0_2_ = (short)new_width;
      }
      JVar1 = (JOCTET)((ushort)(undefined2)new_value >> 8);
      if (bVar2) {
        data[offset + 2] = '\0';
        data[offset + 3] = '\x04';
        data[offset + 4] = '\0';
        data[offset + 5] = '\0';
        data[offset + 6] = '\0';
        data[offset + 7] = '\x01';
        data[offset + 8] = '\0';
        data[offset + 9] = '\0';
        data[offset + 10] = JVar1;
        data[offset + 0xb] = (JOCTET)(undefined2)new_value;
      }
      else {
        data[offset + 2] = '\x04';
        data[offset + 3] = '\0';
        data[offset + 4] = '\x01';
        data[offset + 5] = '\0';
        data[offset + 6] = '\0';
        data[offset + 7] = '\0';
        data[offset + 8] = (JOCTET)(undefined2)new_value;
        data[offset + 9] = JVar1;
        data[offset + 10] = '\0';
        data[offset + 0xb] = '\0';
      }
    }
    offset = offset + 0xc;
    number_of_tags = number_of_tags - 1;
  } while (number_of_tags != 0);
  return;
}

Assistant:

LOCAL(void)
adjust_exif_parameters(JOCTET *data, unsigned int length, JDIMENSION new_width,
                       JDIMENSION new_height)
{
  boolean is_motorola; /* Flag for byte order */
  unsigned int number_of_tags, tagnum;
  unsigned int firstoffset, offset;
  JDIMENSION new_value;

  if (length < 12) return; /* Length of an IFD entry */

  /* Discover byte order */
  if (data[0] == 0x49 && data[1] == 0x49)
    is_motorola = FALSE;
  else if (data[0] == 0x4D && data[1] == 0x4D)
    is_motorola = TRUE;
  else
    return;

  /* Check Tag Mark */
  if (is_motorola) {
    if (data[2] != 0) return;
    if (data[3] != 0x2A) return;
  } else {
    if (data[3] != 0) return;
    if (data[2] != 0x2A) return;
  }

  /* Get first IFD offset (offset to IFD0) */
  if (is_motorola) {
    if (data[4] != 0) return;
    if (data[5] != 0) return;
    firstoffset = data[6];
    firstoffset <<= 8;
    firstoffset += data[7];
  } else {
    if (data[7] != 0) return;
    if (data[6] != 0) return;
    firstoffset = data[5];
    firstoffset <<= 8;
    firstoffset += data[4];
  }
  if (firstoffset > length - 2) return; /* check end of data segment */

  /* Get the number of directory entries contained in this IFD */
  if (is_motorola) {
    number_of_tags = data[firstoffset];
    number_of_tags <<= 8;
    number_of_tags += data[firstoffset + 1];
  } else {
    number_of_tags = data[firstoffset + 1];
    number_of_tags <<= 8;
    number_of_tags += data[firstoffset];
  }
  if (number_of_tags == 0) return;
  firstoffset += 2;

  /* Search for ExifSubIFD offset Tag in IFD0 */
  for (;;) {
    if (firstoffset > length - 12) return; /* check end of data segment */
    /* Get Tag number */
    if (is_motorola) {
      tagnum = data[firstoffset];
      tagnum <<= 8;
      tagnum += data[firstoffset + 1];
    } else {
      tagnum = data[firstoffset + 1];
      tagnum <<= 8;
      tagnum += data[firstoffset];
    }
    if (tagnum == 0x8769) break; /* found ExifSubIFD offset Tag */
    if (--number_of_tags == 0) return;
    firstoffset += 12;
  }

  /* Get the ExifSubIFD offset */
  if (is_motorola) {
    if (data[firstoffset + 8] != 0) return;
    if (data[firstoffset + 9] != 0) return;
    offset = data[firstoffset + 10];
    offset <<= 8;
    offset += data[firstoffset + 11];
  } else {
    if (data[firstoffset + 11] != 0) return;
    if (data[firstoffset + 10] != 0) return;
    offset = data[firstoffset + 9];
    offset <<= 8;
    offset += data[firstoffset + 8];
  }
  if (offset > length - 2) return; /* check end of data segment */

  /* Get the number of directory entries contained in this SubIFD */
  if (is_motorola) {
    number_of_tags = data[offset];
    number_of_tags <<= 8;
    number_of_tags += data[offset + 1];
  } else {
    number_of_tags = data[offset + 1];
    number_of_tags <<= 8;
    number_of_tags += data[offset];
  }
  if (number_of_tags < 2) return;
  offset += 2;

  /* Search for ExifImageWidth and ExifImageHeight Tags in this SubIFD */
  do {
    if (offset > length - 12) return; /* check end of data segment */
    /* Get Tag number */
    if (is_motorola) {
      tagnum = data[offset];
      tagnum <<= 8;
      tagnum += data[offset + 1];
    } else {
      tagnum = data[offset + 1];
      tagnum <<= 8;
      tagnum += data[offset];
    }
    if (tagnum == 0xA002 || tagnum == 0xA003) {
      if (tagnum == 0xA002)
        new_value = new_width; /* ExifImageWidth Tag */
      else
        new_value = new_height; /* ExifImageHeight Tag */
      if (is_motorola) {
        data[offset + 2] = 0; /* Format = unsigned long (4 octets) */
        data[offset + 3] = 4;
        data[offset + 4] = 0; /* Number Of Components = 1 */
        data[offset + 5] = 0;
        data[offset + 6] = 0;
        data[offset + 7] = 1;
        data[offset + 8] = 0;
        data[offset + 9] = 0;
        data[offset + 10] = (JOCTET)((new_value >> 8) & 0xFF);
        data[offset + 11] = (JOCTET)(new_value & 0xFF);
      } else {
        data[offset + 2] = 4; /* Format = unsigned long (4 octets) */
        data[offset + 3] = 0;
        data[offset + 4] = 1; /* Number Of Components = 1 */
        data[offset + 5] = 0;
        data[offset + 6] = 0;
        data[offset + 7] = 0;
        data[offset + 8] = (JOCTET)(new_value & 0xFF);
        data[offset + 9] = (JOCTET)((new_value >> 8) & 0xFF);
        data[offset + 10] = 0;
        data[offset + 11] = 0;
      }
    }
    offset += 12;
  } while (--number_of_tags);
}